

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O1

void __thiscall
helics::apps::BrokerServer::BrokerServer
          (BrokerServer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  undefined1 local_60 [16];
  undefined8 local_50;
  _Alloc_hider local_40;
  undefined8 local_38;
  
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->zmq_server = false;
  this->zmq_ss_server = false;
  this->tcp_server = false;
  this->udp_server = false;
  this->udp_server = false;
  this->http_server = false;
  this->websocket_server = false;
  this->exitall = (__atomic_base<bool>)0x0;
  (this->configFile_)._M_dataplus._M_p = (pointer)&(this->configFile_).field_2;
  (this->configFile_)._M_string_length = 0;
  (this->configFile_).field_2._M_local_buf[0] = '\0';
  gmlc::utilities::randomString_abi_cxx11_(0x1c04d6);
  pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                  "_broker_server");
  paVar1 = &(this->server_name_).field_2;
  (this->server_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar3 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->server_name_).field_2 + 8) = uVar3;
  }
  else {
    (this->server_name_)._M_dataplus._M_p = pcVar2;
    (this->server_name_).field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  (this->server_name_)._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  if ((helicsCLI11App *)local_60._0_8_ != (helicsCLI11App *)&stack0xffffffffffffffb0) {
    operator_delete((void *)local_60._0_8_,local_50 + 1);
  }
  local_38 = &this->config_;
  (this->config_)._M_t.
  super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
  .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl = (JsonStorage *)0x0;
  local_40._M_p = (pointer)&(this->mHttpArgs).field_2;
  (this->mHttpArgs)._M_dataplus._M_p = local_40._M_p;
  (this->mHttpArgs)._M_string_length = 0;
  (this->mHttpArgs).field_2._M_local_buf[0] = '\0';
  (this->mWebSocketArgs)._M_dataplus._M_p = (pointer)&(this->mWebSocketArgs).field_2;
  (this->mWebSocketArgs)._M_string_length = 0;
  (this->mWebSocketArgs).field_2._M_local_buf[0] = '\0';
  (this->mZmqArgs)._M_dataplus._M_p = (pointer)&(this->mZmqArgs).field_2;
  (this->mZmqArgs)._M_string_length = 0;
  (this->mZmqArgs).field_2._M_local_buf[0] = '\0';
  (this->mTcpArgs)._M_dataplus._M_p = (pointer)&(this->mTcpArgs).field_2;
  (this->mTcpArgs)._M_string_length = 0;
  (this->mTcpArgs).field_2._M_local_buf[0] = '\0';
  (this->mUdpArgs)._M_dataplus._M_p = (pointer)&(this->mUdpArgs).field_2;
  (this->mUdpArgs)._M_string_length = 0;
  (this->mUdpArgs).field_2._M_local_buf[0] = '\0';
  (this->mMpiArgs)._M_dataplus._M_p = (pointer)&(this->mMpiArgs).field_2;
  (this->mMpiArgs)._M_string_length = 0;
  (this->mMpiArgs).field_2._M_local_buf[0] = '\0';
  generateArgProcessing((BrokerServer *)local_60);
  helicsCLI11App::
  helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((helicsCLI11App *)local_60._0_8_,args);
  if ((helicsCLI11App *)local_60._0_8_ != (helicsCLI11App *)0x0) {
    (**(code **)(*(long *)local_60._0_8_ + 8))();
  }
  return;
}

Assistant:

BrokerServer::BrokerServer(std::vector<std::string> args):
    server_name_{gmlc::utilities::randomString(5) + "_broker_server"}
{
    auto app = generateArgProcessing();
    app->helics_parse(args);
}